

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  SourceLocation location;
  long in_RSI;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_58;
  PromiseFulfillerPair<void> local_48;
  
  local_58.disposer = (Disposer *)(CONCAT71(local_58.disposer._1_7_,*(char *)(in_RSI + 0x70)) ^ 1);
  if (*(char *)(in_RSI + 0x70) == '\0') {
    *(undefined1 *)(in_RSI + 0x70) = 1;
    (**(code **)(**(long **)(in_RSI + 0x90) + 0x10))(*(long **)(in_RSI + 0x90),&local_48);
    if (*(int *)(in_RSI + 0x98) == 0) {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
    else {
      location.function = "drain";
      location.fileName =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      location.lineNumber = 0x1fd3;
      location.columnNumber = 0x10;
      newPromiseAndFulfiller<void>(location);
      local_58.disposer = local_48.fulfiller.disposer;
      local_58.ptr = local_48.fulfiller.ptr;
      local_48.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0xa0),&local_58);
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_58);
      (this->super_ErrorHandler)._vptr_ErrorHandler =
           (_func_int **)local_48.promise.super_PromiseBase.node.ptr;
      local_48.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_48);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            ((Fault *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fcb,FAILED,"!draining","_kjCondition,\"you can only call drain() once\"",
             (DebugExpression<bool> *)&local_58,(char (*) [31])"you can only call drain() once");
  kj::_::Debug::Fault::fatal((Fault *)&local_48);
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}